

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promp.cpp
# Opt level: O3

VectorXd __thiscall ProMP::generateTrajectory(ProMP *this,int requiredTrajLen)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer pMVar4;
  int iVar5;
  double *pdVar6;
  double *pdVar7;
  undefined8 *puVar8;
  ulong uVar9;
  char *pcVar10;
  uint in_EDX;
  Index extraout_RDX;
  long lVar11;
  undefined4 in_register_00000034;
  ProMP *this_00;
  ulong uVar12;
  VectorXd VVar13;
  MatrixXd newStdW;
  VectorXd point;
  MatrixXd phiT;
  VectorXd sig;
  VectorXd newMeanW;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  gentrajDemoLen;
  VectorXd sampleW;
  VectorXd newPhase_;
  MatrixXd phi;
  VectorXd phase1;
  Phase newPhase;
  DenseStorage<double,__1,__1,__1,_0> local_1d0;
  DenseStorage<double,__1,__1,__1,_0> local_1b8;
  DenseStorage<double,__1,__1,__1,_0> local_1a0;
  Matrix<double,__1,__1,_0,__1,__1> local_188;
  ProMP *local_170;
  undefined1 local_168 [24];
  XprType local_150;
  undefined1 local_130 [32];
  void *local_110;
  DenseStorage<double,__1,__1,_1,_0> local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>_>
  local_e8;
  MatrixXd local_88;
  undefined1 local_70 [16];
  Phase local_60;
  
  this_00 = (ProMP *)CONCAT44(in_register_00000034,requiredTrajLen);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)local_168,
             (DenseStorage<double,__1,__1,_1,_0> *)&this_00->meanW_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_1d0,(DenseStorage<double,__1,__1,__1,_0> *)&this_00->stdW_);
  Phase::Phase((Phase *)(local_70 + 0x10),this_00->dt_,1.0,this_00->trajLength_);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_f8,(DenseStorage<double,__1,__1,_1,_0> *)(local_70 + 0x10));
  generateBasisFunction(&local_88,this_00,(VectorXd *)&local_f8,this_00->trajLength_);
  local_170 = this;
  if ((this_00->viaPoints_).
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_00->viaPoints_).
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      Phase::getPhaseFromTime((Phase *)local_70,(int)local_70 + 0x10);
      generateBasisFunction((MatrixXd *)&local_1a0,this_00,(VectorXd *)local_70,1);
      local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      pdVar6 = (double *)malloc(8);
      if (pdVar6 == (double *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = std::ios::widen;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           1;
      pMVar4 = (this_00->viaPoints_).
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *pdVar6 = *(double *)
                 ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar11 + 0x10);
      local_1b8.m_data = (double *)0x0;
      local_1b8.m_rows = 0;
      local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           pdVar6;
      pdVar7 = (double *)malloc(8);
      if (pdVar7 == (double *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = std::ios::widen;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_1b8.m_rows = 1;
      *pdVar7 = *(double *)
                 ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar11 + 8);
      local_1b8.m_data = pdVar7;
      if (local_1a0.m_rows != local_1d0.m_rows) {
LAB_001159c9:
        pcVar10 = 
        "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
        ;
        goto LAB_00115b2f;
      }
      if (local_1d0.m_cols != local_1a0.m_rows) {
        pcVar10 = 
        "Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
        ;
        goto LAB_00115b2f;
      }
      local_168._16_8_ = &local_188;
      local_150.m_lhs.m_rhs = (RhsNested)&local_1d0;
      local_150.m_lhs.m_lhs.m_matrix = (non_const_type)&local_1a0;
      local_150.m_rhs = (RhsNested)&local_1a0;
      if (local_1a0.m_cols != 1) {
        pcVar10 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>]"
        ;
        goto LAB_00115b10;
      }
      local_130._8_8_ = pdVar6;
      Eigen::internal::
      product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           *)(local_130 + 0x10),&local_150);
      dVar1 = *(double *)local_130._8_8_;
      dVar2 = *(double *)local_130._16_8_;
      free(local_110);
      this = local_170;
      if ((local_1a0.m_cols | local_1d0.m_rows) < 0) {
LAB_001159e3:
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                     );
      }
      if (local_1a0.m_rows != local_168._8_8_) goto LAB_00115a02;
      if (local_1b8.m_rows != local_1a0.m_cols) {
        pcVar10 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>]"
        ;
LAB_00115b10:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar10);
      }
      local_e8.m_rhs.m_lhs.m_lhs.m_lhs = (LhsNested)&local_1d0;
      local_e8.m_rhs.m_lhs.m_rhs.m_rows.m_value = local_1d0.m_rows;
      local_e8.m_rhs.m_lhs.m_rhs.m_cols.m_value = local_1a0.m_cols;
      local_e8.m_rhs.m_rhs.m_lhs = (LhsNested)&local_1b8;
      local_e8.m_lhs = (LhsNested)local_168;
      local_e8.m_rhs.m_lhs.m_lhs.m_rhs = (RhsNested)&local_1a0;
      local_e8.m_rhs.m_lhs.m_rhs.m_functor.m_other = dVar1 + dVar2;
      local_e8.m_rhs.m_rhs.m_rhs.m_lhs.m_matrix = (non_const_type)&local_1a0;
      local_e8.m_rhs.m_rhs.m_rhs.m_rhs = (RhsNested)local_168;
      if (local_1a0.m_rows != local_1d0.m_rows) {
        pcVar10 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>>>]"
        ;
        goto LAB_00115b10;
      }
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_168,&local_e8,
                 (assign_op<double,_double> *)local_130,(type)0x0);
      if (local_1d0.m_cols != local_1a0.m_rows) {
        pcVar10 = 
        "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
        ;
        goto LAB_00115b2f;
      }
      if (((local_150.m_lhs.m_lhs.m_matrix)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols < 1) {
        pcVar10 = 
        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>>, 0>::operator()(Index) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>>, Level = 0]"
        ;
        goto LAB_00115aac;
      }
      local_130._8_8_ =
           (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168._16_8_)->
           m_storage).m_data;
      Eigen::internal::
      product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           *)(local_130 + 0x10),&local_150);
      dVar1 = *(double *)local_130._8_8_;
      dVar2 = *(double *)local_130._16_8_;
      free(local_110);
      if ((local_1a0.m_cols | local_1d0.m_rows) < 0) goto LAB_001159e3;
      if (local_1a0.m_rows != local_1d0.m_rows) goto LAB_001159c9;
      local_e8.m_lhs = (LhsNested)&local_1d0;
      local_e8.m_rhs.m_lhs.m_rhs.m_rows.m_value = local_1d0.m_rows;
      local_e8.m_rhs.m_lhs.m_rhs.m_cols.m_value = local_1a0.m_cols;
      local_e8.m_rhs.m_lhs.m_lhs.m_lhs = (LhsNested)local_e8.m_lhs;
      local_e8.m_rhs.m_lhs.m_lhs.m_rhs = (RhsNested)&local_1a0;
      local_e8.m_rhs.m_lhs.m_rhs.m_functor.m_other = dVar1 + dVar2;
      local_e8.m_rhs.m_rhs.m_lhs = (LhsNested)&local_1a0;
      local_e8.m_rhs.m_rhs.m_rhs.m_lhs.m_matrix = (non_const_type)local_e8.m_lhs;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_e8.m_lhs,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_0>_>
                  *)&local_e8,(assign_op<double,_double> *)local_130,(type)0x0);
      free(local_1b8.m_data);
      free(local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(local_1a0.m_data);
      free((void *)local_70._0_8_);
      uVar12 = uVar12 + 1;
      uVar9 = ((long)(this_00->viaPoints_).
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this_00->viaPoints_).
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar11 = lVar11 + 0x18;
    } while (uVar12 <= uVar9 && uVar9 - uVar12 != 0);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)local_130,
             (DenseStorage<double,__1,__1,_1,_0> *)local_168);
  if (local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows ==
      local_130._8_8_) {
    local_168._16_8_ = &local_88;
    iVar3 = this_00->trajLength_;
    *(undefined8 *)this = 0;
    this->stdBf_ = 0.0;
    local_150.m_lhs.m_lhs.m_matrix = (non_const_type)local_130;
    if ((int)in_EDX < 0) {
      __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    uVar12 = (ulong)in_EDX;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this,uVar12,uVar12,1);
    if (in_EDX != 0) {
      uVar9 = 0;
      do {
        iVar5 = (int)((double)(int)uVar9 * ((double)(iVar3 + -1) / (double)(int)in_EDX));
        if ((iVar5 < 0) ||
           ((((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168._16_8_)->
            m_storage).m_cols <= (long)iVar5)) {
          pcVar10 = 
          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>, Level = 0]"
          ;
LAB_00115aac:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,pcVar10);
        }
        Eigen::internal::
        product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             *)&local_e8,(XprType *)(local_168 + 0x10));
        pdVar6 = (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                    &(local_e8.m_lhs)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)->m_storage).
                   m_data)[iVar5];
        free(local_e8.m_rhs.m_lhs.m_lhs.m_lhs);
        if ((long)this->stdBf_ <= (long)uVar9) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        *(double **)(*(long *)this + uVar9 * 8) = pdVar6;
        uVar9 = uVar9 + 1;
      } while (uVar12 != uVar9);
    }
    free((void *)local_130._0_8_);
    free(local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free(local_f8.m_data);
    free(local_60.z_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        );
    free(local_1d0.m_data);
    free((void *)local_168._0_8_);
    VVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    VVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (VectorXd)VVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    ;
  }
LAB_00115a02:
  pcVar10 = 
  "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
  ;
LAB_00115b2f:
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar10);
}

Assistant:

Eigen::VectorXd ProMP::generateTrajectory(int requiredTrajLen){
	double phaseSpeed = 1.0;
	auto newMeanW = meanW_;
	auto newStdW = stdW_;
	int timeSteps = (int)(trajLength_/phaseSpeed);
	Phase newPhase(dt_,phaseSpeed,timeSteps);
	auto newPhase_ = newPhase.getPhase();
	auto phi = generateBasisFunction(newPhase_,trajLength_);
	for(int i=0;i<viaPoints_.size();++i){
		auto phase1 = newPhase.getPhaseFromTime(viaPoints_[i][0]);
		auto phiT = generateBasisFunction(phase1,1);
		Eigen::VectorXd sig(1);
		sig(0) = viaPoints_[i][2];
		Eigen::VectorXd point(1);
		point(0) = viaPoints_[i][1];
		auto aux = sig + (phiT.transpose()*newStdW)*phiT;
		newMeanW = newMeanW + (newStdW*phiT/aux(0))*(point - phiT.transpose()*newMeanW);
		newStdW = newStdW - (newStdW*phiT/aux(0)) * (phiT.transpose()*newStdW);
		}
	auto sampleW = newMeanW;
	auto gentrajDemoLen =  phi.transpose()*sampleW;
	double delta = (trajLength_-1)*1.0/(requiredTrajLen);
	Eigen::VectorXd gentrajReqLen(requiredTrajLen);
	for (int i=0;i<requiredTrajLen;++i){
		gentrajReqLen(i) = gentrajDemoLen((int)(i*delta));
		}
	return gentrajReqLen;
	}